

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

void __thiscall Token::Token(Token *this)

{
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_relOp,"",&local_1a);
  this->_ded = false;
  this->_isWholeNumber = false;
  this->_isString = false;
  this->_symbol = '\0';
  this->_eof = false;
  this->_eol = false;
  this->_ind = false;
  this->_ded = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_string,"",&local_1b);
  return;
}

Assistant:

Token::Token(): _name{""}, _eof{false}, _eol{false}, _symbol{'\0'},
_isWholeNumber{false}, _ind{false},_ded{false}, _relOp{""}, _string{""},_isString{false}{}